

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O3

void __thiscall OpenMD::SimInfo::calcNConstraints(SimInfo *this)

{
  MPI_Allreduce(&this->nConstraints_,&this->nGlobalConstraints_,1,&ompi_mpi_int,&ompi_mpi_op_sum,
                &ompi_mpi_comm_world);
  return;
}

Assistant:

void SimInfo::calcNConstraints() {
#ifdef IS_MPI
    MPI_Allreduce(&nConstraints_, &nGlobalConstraints_, 1, MPI_INT, MPI_SUM,
                  MPI_COMM_WORLD);
#else
    nGlobalConstraints_     = nConstraints_;
#endif
  }